

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O1

gdImagePtr gdImageRotate180(gdImagePtr src,int ignoretransparent)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  gdImagePtr to;
  int color;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  if (src->trueColor == 0) {
    pcVar3 = gdImageGetPixel;
  }
  else {
    pcVar3 = gdImageGetTrueColorPixel;
  }
  to = gdImageCreateTrueColor(src->sx,src->sy);
  if (to != (gdImagePtr)0x0) {
    iVar1 = to->alphaBlendingFlag;
    to->alphaBlendingFlag = 0;
    to->transparent = src->transparent;
    gdImagePaletteCopy(to,src);
    if (0 < src->sy) {
      uVar4 = 0;
      do {
        if (0 < src->sx) {
          iVar5 = 0;
          iVar6 = -1;
          do {
            iVar2 = (*pcVar3)(src,iVar5,uVar4);
            if (src->trueColor == 0) {
              iVar2 = src->green[iVar2] * 0x100 + src->red[iVar2] * 0x10000 + src->blue[iVar2] +
                      src->alpha[iVar2] * 0x1000000;
            }
            if ((ignoretransparent == 0) || (color = to->transparent, iVar2 != to->transparent)) {
              color = iVar2;
            }
            gdImageSetPixel(to,to->sx + iVar6,to->sy + ~uVar4,color);
            iVar5 = iVar5 + 1;
            iVar6 = iVar6 + -1;
          } while (iVar5 < src->sx);
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < src->sy);
    }
    to->alphaBlendingFlag = iVar1;
  }
  return to;
}

Assistant:

gdImagePtr gdImageRotate180 (gdImagePtr src, int ignoretransparent)
{
	int uY, uX;
	int c,r,g,b,a;
	gdImagePtr dst;
	FuncPtr f;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}
	dst = gdImageCreateTrueColor(src->sx, src->sy);

	if (dst != NULL) {
		int old_blendmode = dst->alphaBlendingFlag;
		dst->alphaBlendingFlag = 0;

		dst->transparent = src->transparent;

		gdImagePaletteCopy (dst, src);

		for (uY = 0; uY<src->sy; uY++) {
			for (uX = 0; uX<src->sx; uX++) {
				c = f (src, uX, uY);
				if (!src->trueColor) {
					r = gdImageRed(src,c);
					g = gdImageGreen(src,c);
					b = gdImageBlue(src,c);
					a = gdImageAlpha(src,c);
					c = gdTrueColorAlpha(r, g, b, a);
				}

				if (ignoretransparent && c == dst->transparent) {
					gdImageSetPixel(dst, (dst->sx - uX - 1), (dst->sy - uY - 1), dst->transparent);
				} else {
					gdImageSetPixel(dst, (dst->sx - uX - 1), (dst->sy - uY - 1), c);
				}
			}
		}
		dst->alphaBlendingFlag = old_blendmode;
	}

	return dst;
}